

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void __thiscall FormatterTest_FormatDouble_Test::TestBody(FormatterTest_FormatDouble_Test *this)

{
  double *in_RCX;
  double *pdVar1;
  char *pcVar2;
  char (*pacVar3) [256];
  char (*buffer_00) [256];
  char *pcVar4;
  AssertionResult gtest_ar_8;
  AssertHelper local_140;
  AssertionResult gtest_ar;
  char buffer [256];
  
  buffer[0] = '3';
  buffer[1] = '3';
  buffer[2] = '3';
  buffer[3] = '3';
  buffer[4] = '3';
  buffer[5] = '3';
  buffer[6] = -0xd;
  buffer[7] = '?';
  check_unknown_types<double>((double *)buffer,"eEfFgGaA","double");
  gtest_ar_8.success_ = false;
  gtest_ar_8._1_7_ = 0;
  fmt::v5::format<char[4],double>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,(v5 *)"{:}"
             ,&gtest_ar_8.success_,in_RCX);
  pdVar1 = (double *)0x1fa90d;
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"0\"","format(\"{:}\", 0.0)",(char (*) [2])0x1fa90d,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer);
  std::__cxx11::string::~string((string *)buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)buffer);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pdVar1 = (double *)0x5af;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x5af,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8,(Message *)buffer);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)buffer);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_8.success_ = false;
  gtest_ar_8._1_7_ = 0;
  fmt::v5::format<char[5],double>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
             (v5 *)"{:f}",&gtest_ar_8.success_,pdVar1);
  pcVar2 = "0.000000";
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"0.000000\"","format(\"{:f}\", 0.0)",(char (*) [9])"0.000000",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer);
  std::__cxx11::string::~string((string *)buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)buffer);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar2 = (char *)0x5b0;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x5b0,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8,(Message *)buffer);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)buffer);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_8.success_ = false;
  gtest_ar_8._1_7_ = 0;
  fmt::v5::format<char[5],double>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
             (v5 *)"{:g}",&gtest_ar_8.success_,(double *)pcVar2);
  pdVar1 = (double *)0x1fa90d;
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"0\"","format(\"{:g}\", 0.0)",(char (*) [2])0x1fa90d,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer);
  std::__cxx11::string::~string((string *)buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)buffer);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pdVar1 = (double *)0x5b1;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x5b1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8,(Message *)buffer);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)buffer);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_8.success_ = true;
  gtest_ar_8._1_7_ = 0x40788a66666666;
  fmt::v5::format<char[4],double>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,(v5 *)"{:}"
             ,&gtest_ar_8.success_,pdVar1);
  pcVar2 = "392.65";
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"392.65\"","format(\"{:}\", 392.65)",(char (*) [7])"392.65",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer);
  std::__cxx11::string::~string((string *)buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)buffer);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar2 = (char *)0x5b2;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x5b2,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8,(Message *)buffer);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)buffer);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_8.success_ = true;
  gtest_ar_8._1_7_ = 0x40788a66666666;
  fmt::v5::format<char[5],double>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
             (v5 *)"{:g}",&gtest_ar_8.success_,(double *)pcVar2);
  pcVar2 = "392.65";
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"392.65\"","format(\"{:g}\", 392.65)",(char (*) [7])"392.65",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer);
  std::__cxx11::string::~string((string *)buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)buffer);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar2 = (char *)0x5b3;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x5b3,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8,(Message *)buffer);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)buffer);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_8.success_ = true;
  gtest_ar_8._1_7_ = 0x40788a66666666;
  fmt::v5::format<char[5],double>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
             (v5 *)"{:G}",&gtest_ar_8.success_,(double *)pcVar2);
  pcVar2 = "392.65";
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"392.65\"","format(\"{:G}\", 392.65)",(char (*) [7])"392.65",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer);
  std::__cxx11::string::~string((string *)buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)buffer);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar2 = (char *)0x5b4;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x5b4,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8,(Message *)buffer);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)buffer);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_8.success_ = true;
  gtest_ar_8._1_7_ = 0x40788a66666666;
  fmt::v5::format<char[5],double>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
             (v5 *)"{:f}",&gtest_ar_8.success_,(double *)pcVar2);
  pcVar2 = "392.650000";
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"392.650000\"","format(\"{:f}\", 392.65)",
             (char (*) [11])"392.650000",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer);
  std::__cxx11::string::~string((string *)buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)buffer);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar2 = (char *)0x5b5;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x5b5,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8,(Message *)buffer);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)buffer);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_8.success_ = true;
  gtest_ar_8._1_7_ = 0x40788a66666666;
  fmt::v5::format<char[5],double>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
             (v5 *)"{:F}",&gtest_ar_8.success_,(double *)pcVar2);
  pcVar2 = "392.650000";
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"392.650000\"","format(\"{:F}\", 392.65)",
             (char (*) [11])"392.650000",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer);
  std::__cxx11::string::~string((string *)buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)buffer);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar2 = (char *)0x5b6;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x5b6,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8,(Message *)buffer);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)buffer);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  pacVar3 = &buffer;
  safe_sprintf<256ul>(pacVar3,"%e",0x40788a6666666666);
  local_140.data_ = (AssertHelperData *)0x40788a6666666666;
  fmt::v5::format<char[6],double>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (v5 *)"{0:e}",(char (*) [6])&local_140,(double *)pcVar2);
  testing::internal::CmpHelperEQ<char[256],std::__cxx11::string>
            ((internal *)&gtest_ar_8,"buffer","format(\"{0:e}\", 392.65)",pacVar3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_8.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_8.message_.ptr_)->_M_dataplus)._M_p;
    }
    pacVar3 = (char (*) [256])0x5b9;
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x5b9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_8.message_);
  buffer_00 = &buffer;
  safe_sprintf<256ul>(buffer_00,"%E",0x40788a6666666666);
  local_140.data_ = (AssertHelperData *)0x40788a6666666666;
  fmt::v5::format<char[6],double>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (v5 *)"{0:E}",(char (*) [6])&local_140,(double *)pacVar3);
  testing::internal::CmpHelperEQ<char[256],std::__cxx11::string>
            ((internal *)&gtest_ar_8,"buffer","format(\"{0:E}\", 392.65)",buffer_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_8.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_8.message_.ptr_)->_M_dataplus)._M_p;
    }
    buffer_00 = (char (*) [256])0x5bb;
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x5bb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_8.message_);
  local_140.data_ = (AssertHelperData *)0x40788a6666666666;
  fmt::v5::format<char[12],double>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (v5 *)"{0:+010.4g}",(char (*) [12])&local_140,(double *)buffer_00);
  pcVar2 = "+0000392.6";
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)&gtest_ar_8,"\"+0000392.6\"","format(\"{0:+010.4g}\", 392.65)",
             (char (*) [11])"+0000392.6",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_8.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_8.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar2 = (char *)0x5bc;
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x5bc,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_8.message_);
  pacVar3 = &buffer;
  safe_sprintf<256ul>(pacVar3,"%a",0xc045000000000000);
  local_140.data_ = (AssertHelperData *)0xc045000000000000;
  fmt::v5::format<char[5],double>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (v5 *)"{:a}",(char (*) [5])&local_140,(double *)pcVar2);
  testing::internal::CmpHelperEQ<char[256],std::__cxx11::string>
            ((internal *)&gtest_ar_8,"buffer","format(\"{:a}\", -42.0)",pacVar3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_8.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_8.message_.ptr_)->_M_dataplus)._M_p;
    }
    pacVar3 = (char (*) [256])0x5be;
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x5be,pcVar2);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_8.message_);
  safe_sprintf<256ul>(&buffer,"%A",0xc045000000000000);
  local_140.data_ = (AssertHelperData *)0xc045000000000000;
  fmt::v5::format<char[5],double>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (v5 *)"{:A}",(char (*) [5])&local_140,(double *)pacVar3);
  testing::internal::CmpHelperEQ<char[256],std::__cxx11::string>
            ((internal *)&gtest_ar_8,"buffer","format(\"{:A}\", -42.0)",&buffer,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_8.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x5c0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_8.message_);
  return;
}

Assistant:

TEST(FormatterTest, FormatDouble) {
  check_unknown_types(1.2, "eEfFgGaA", "double");
  EXPECT_EQ("0", format("{:}", 0.0));
  EXPECT_EQ("0.000000", format("{:f}", 0.0));
  EXPECT_EQ("0", format("{:g}", 0.0));
  EXPECT_EQ("392.65", format("{:}", 392.65));
  EXPECT_EQ("392.65", format("{:g}", 392.65));
  EXPECT_EQ("392.65", format("{:G}", 392.65));
  EXPECT_EQ("392.650000", format("{:f}", 392.65));
  EXPECT_EQ("392.650000", format("{:F}", 392.65));
  char buffer[BUFFER_SIZE];
  safe_sprintf(buffer, "%e", 392.65);
  EXPECT_EQ(buffer, format("{0:e}", 392.65));
  safe_sprintf(buffer, "%E", 392.65);
  EXPECT_EQ(buffer, format("{0:E}", 392.65));
  EXPECT_EQ("+0000392.6", format("{0:+010.4g}", 392.65));
  safe_sprintf(buffer, "%a", -42.0);
  EXPECT_EQ(buffer, format("{:a}", -42.0));
  safe_sprintf(buffer, "%A", -42.0);
  EXPECT_EQ(buffer, format("{:A}", -42.0));
}